

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbwindow.cpp
# Opt level: O3

void __thiscall QFbWindow::repaint(QFbWindow *this,QRegion *region)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QFbScreen *pQVar5;
  int *piVar6;
  int *piVar7;
  Representation RVar8;
  Representation RVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar10 = (QRect)(**(code **)(*(long *)this + 0x30))();
  local_48._0_4_ = (this->mOldGeometry).x1;
  local_48._4_4_ = (this->mOldGeometry).y1;
  uStack_40._0_4_ = (this->mOldGeometry).x2;
  uStack_40._4_4_ = (this->mOldGeometry).y2;
  this->mOldGeometry = QVar10;
  RVar9 = QVar10.x1.m_i;
  RVar8 = QVar10.y1.m_i;
  if (((((undefined4)local_48 != RVar9.m_i) || ((undefined4)uStack_40 != QVar10.x2.m_i.m_i)) ||
      (local_48._4_4_ != RVar8.m_i)) || (uStack_40._4_4_ != QVar10.y2.m_i.m_i)) {
    pQVar5 = platformScreen(this);
    (**(code **)(*(long *)pQVar5 + 0xd0))(pQVar5,&local_48);
  }
  piVar6 = (int *)QRegion::begin();
  piVar7 = (int *)QRegion::end();
  for (; piVar6 != piVar7; piVar6 = piVar6 + 4) {
    iVar1 = *piVar6;
    iVar2 = piVar6[1];
    iVar3 = piVar6[2];
    iVar4 = piVar6[3];
    pQVar5 = platformScreen(this);
    local_58 = CONCAT44(iVar2 + RVar8.m_i,iVar1 + RVar9.m_i);
    local_50 = CONCAT44(iVar4 + RVar8.m_i,iVar3 + RVar9.m_i);
    (**(code **)(*(long *)pQVar5 + 0xd0))(pQVar5,&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbWindow::repaint(const QRegion &region)
{
    const QRect currentGeometry = geometry();
    const QRect oldGeometryLocal = mOldGeometry;
    mOldGeometry = currentGeometry;
    // If this is a move, redraw the previous location
    if (oldGeometryLocal != currentGeometry)
        platformScreen()->setDirty(oldGeometryLocal);
    auto topLeft = currentGeometry.topLeft();
    for (auto rect : region)
        platformScreen()->setDirty(rect.translated(topLeft));
}